

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash.cc
# Opt level: O2

uint64_t farmhashuo::Hash64WithSeeds(char *s,size_t len,uint64_t seed0,uint64_t seed1)

{
  long *plVar1;
  long *plVar2;
  long lVar3;
  uint64_t uVar4;
  long lVar5;
  long *plVar6;
  long lVar7;
  unsigned_long extraout_RDX;
  long lVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  pair<unsigned_long,_unsigned_long> pVar23;
  pair<unsigned_long,_unsigned_long> pVar24;
  uint128_t x;
  ulong local_60;
  
  if (0x40 < len) {
    uVar13 = 0;
    lVar12 = seed1 * -0x651e95c4d06fbfb1 + 0x71;
    uVar16 = (ulong)(lVar12 * -0x651e95c4d06fbfb1) >> 0x2f ^ lVar12 * -0x651e95c4d06fbfb1;
    lVar18 = seed0 + uVar16 * 0x651e95c4d06fbfb1;
    lVar17 = seed0 * -0x651e95c4d06fbfb1;
    lVar5 = (ulong)((uint)lVar18 & 0x82) + 0x9ae16a3b2f90404f;
    uVar21 = (ulong)((uint)(len - 1) & 0x3f);
    plVar6 = (long *)(s + (len - 1 & 0xffffffffffffffc0));
    lVar7 = 0;
    local_60 = uVar16 * -0x651e95c4d06fbfb1;
    do {
      plVar1 = (long *)((long)s + 0x18);
      lVar3 = *(long *)((long)s + 0x30);
      lVar20 = *(long *)((long)s + 8);
      lVar10 = uVar13 + *(long *)((long)s + 0x38);
      uVar13 = lVar12 + *(long *)((long)s + 0x10);
      uVar16 = lVar17 + *(long *)s + lVar20;
      lVar12 = lVar18 + *(long *)((long)s + 0x38);
      uVar14 = uVar13 >> 0x1d | uVar13 << 0x23;
      uVar13 = (uVar16 >> 0x1a | uVar16 << 0x26) * 9;
      lVar17 = uVar13 + lVar20;
      uVar16 = (local_60 + *plVar1) * lVar5;
      lVar11 = (uVar16 >> 0x20 | uVar16 << 0x20) + lVar10;
      lVar18 = *(long *)s + lVar3 + lVar11 * 9;
      uVar16 = seed0 + *(long *)((long)s + 0x20);
      lVar7 = (lVar7 + lVar3 ^ uVar13) * 9 + *(long *)((long)s + 0x20);
      lVar8 = (uVar16 >> 0x21 | uVar16 * 0x80000000) + *(long *)((long)s + 0x10);
      plVar2 = (long *)((long)s + 0x28);
      s = (char *)((long)s + 0x40);
      lVar12 = lVar12 + lVar8;
      uVar13 = seed1 + lVar20 + *plVar2;
      lVar20 = lVar17 - lVar12;
      uVar16 = lVar3 + *plVar2 + lVar10 + lVar11 + lVar20;
      seed1 = (uVar13 >> 0x1e | uVar13 << 0x22) + *plVar1 + lVar7;
      seed0 = lVar8 + lVar20;
      lVar7 = lVar7 + seed1;
      lVar17 = lVar17 + uVar16;
      uVar13 = uVar16 >> 0x22 | uVar16 * 0x40000000;
      local_60 = uVar14;
    } while ((long *)s != plVar6);
    uVar19 = seed0 >> 0x14 | seed0 << 0x2c;
    uVar16 = seed1 >> 0x1c | seed1 << 0x24;
    lVar18 = lVar18 * 9 + lVar12;
    uVar15 = lVar12 + lVar18;
    uVar9 = (uVar19 - lVar17) + uVar15 + *(long *)((long)plVar6 + (uVar21 - 0x37));
    uVar14 = uVar14 + lVar7 + uVar21;
    uVar22 = uVar14 >> 0x21 | uVar14 * 0x80000000;
    uVar15 = *(ulong *)((long)plVar6 + (uVar21 - 0xf)) ^ uVar16 ^ uVar15;
    uVar14 = uVar13 * 9 ^ (uVar9 >> 0x25 | uVar9 * 0x8000000) * lVar5;
    uVar9 = uVar19 + *(long *)((long)plVar6 + (uVar21 - 0x17)) +
            (uVar15 >> 0x2a | uVar15 << 0x16) * lVar5;
    lVar12 = uVar22 * lVar5;
    pVar23 = farmhashna::WeakHashLen32WithSeeds
                       ((char *)((long)plVar6 + (uVar21 - 0x3f)),uVar16 * lVar5,
                        lVar7 + uVar21 + uVar14);
    pVar24 = farmhashna::WeakHashLen32WithSeeds
                       ((char *)((long)plVar6 + (uVar21 - 0x1f)),uVar13 + lVar12,
                        *(long *)((long)plVar6 + (uVar21 - 0x2f)) + uVar9);
    uVar16 = lVar12 + pVar24.second;
    uVar13 = pVar24.first ^ uVar9;
    uVar21 = (pVar23.first + uVar14 ^ uVar13) * lVar5;
    uVar9 = (pVar23.second + uVar9 ^ uVar16) * -0x651e95c4d06fbfb1;
    uVar16 = uVar9 >> 0x2f ^ uVar16 ^ uVar9;
    uVar13 = (uVar13 ^ uVar21 ^ uVar21 >> 0x2f) * lVar5;
    uVar14 = (uVar16 * -0x41befec400000000 | uVar16 * -0x651e95c4d06fbfb1 >> 0x1e) *
             -0x651e95c4d06fbfb1 ^ uVar14;
    uVar13 = (((uVar13 ^ uVar13 >> 0x2f) + uVar22) * lVar5 - lVar18 ^ uVar14) * -0x651e95c4d06fbfb1;
    uVar13 = uVar13 >> 0x2f ^ uVar14 ^ uVar13;
    return (uVar13 * 0x5f20809e00000000 | uVar13 * -0x651e95c4d06fbfb1 >> 0x1f) *
           -0x651e95c4d06fbfb1;
  }
  uVar4 = farmhashna::Hash64(s,len);
  x.second = extraout_RDX;
  x.first = seed1;
  uVar4 = util::Hash128to64((util *)(uVar4 - seed0),x);
  return uVar4;
}

Assistant:

uint64_t Hash64WithSeeds(const char *s, size_t len,
                         uint64_t seed0, uint64_t seed1) {
  if (len <= 64) {
    return farmhashna::Hash64WithSeeds(s, len, seed0, seed1);
  }

  // For strings over 64 bytes we loop.  Internal state consists of
  // 64 bytes: u, v, w, x, y, and z.
  uint64_t x = seed0;
  uint64_t y = seed1 * k2 + 113;
  uint64_t z = farmhashna::ShiftMix(y * k2) * k2;
  pair<uint64_t, uint64_t> v = make_pair(seed0, seed1);
  pair<uint64_t, uint64_t> w = make_pair(0, 0);
  uint64_t u = x - z;
  x *= k2;
  uint64_t mul = k2 + (u & 0x82);

  // Set end so that after the loop we have 1 to 64 bytes left to process.
  const char* end = s + ((len - 1) / 64) * 64;
  const char* last64 = end + ((len - 1) & 63) - 63;
  assert(s + len - 64 == last64);
  do {
    uint64_t a0 = Fetch(s);
    uint64_t a1 = Fetch(s + 8);
    uint64_t a2 = Fetch(s + 16);
    uint64_t a3 = Fetch(s + 24);
    uint64_t a4 = Fetch(s + 32);
    uint64_t a5 = Fetch(s + 40);
    uint64_t a6 = Fetch(s + 48);
    uint64_t a7 = Fetch(s + 56);
    x += a0 + a1;
    y += a2;
    z += a3;
    v.first += a4;
    v.second += a5 + a1;
    w.first += a6;
    w.second += a7;

    x = Rotate(x, 26);
    x *= 9;
    y = Rotate(y, 29);
    z *= mul;
    v.first = Rotate(v.first, 33);
    v.second = Rotate(v.second, 30);
    w.first ^= x;
    w.first *= 9;
    z = Rotate(z, 32);
    z += w.second;
    w.second += z;
    z *= 9;
    std::swap(u, y);

    z += a0 + a6;
    v.first += a2;
    v.second += a3;
    w.first += a4;
    w.second += a5 + a6;
    x += a1;
    y += a7;

    y += v.first;
    v.first += x - y;
    v.second += w.first;
    w.first += v.second;
    w.second += x - y;
    x += w.second;
    w.second = Rotate(w.second, 34);
    std::swap(u, z);
    s += 64;
  } while (s != end);
  // Make s point to the last 64 bytes of input.
  s = last64;
  u *= 9;
  v.second = Rotate(v.second, 28);
  v.first = Rotate(v.first, 20);
  w.first += ((len - 1) & 63);
  u += y;
  y += u;
  x = Rotate(y - x + v.first + Fetch(s + 8), 37) * mul;
  y = Rotate(y ^ v.second ^ Fetch(s + 48), 42) * mul;
  x ^= w.second * 9;
  y += v.first + Fetch(s + 40);
  z = Rotate(z + w.first, 33) * mul;
  v = farmhashna::WeakHashLen32WithSeeds(s, v.second * mul, x + w.first);
  w = farmhashna::WeakHashLen32WithSeeds(s + 32, z + w.second, y + Fetch(s + 16));
  return H(farmhashna::HashLen16(v.first + x, w.first ^ y, mul) + z - u,
           H(v.second + y, w.second + z, k2, 30) ^ x,
           k2,
           31);
}